

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O2

void FT_Stream_OpenMemory(FT_Stream stream,FT_Byte *base,FT_ULong size)

{
  stream->base = base;
  stream->size = size;
  stream->pos = 0;
  stream->cursor = (uchar *)0x0;
  stream->read = (FT_Stream_IoFunc)0x0;
  stream->close = (FT_Stream_CloseFunc)0x0;
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Stream_OpenMemory( FT_Stream       stream,
                        const FT_Byte*  base,
                        FT_ULong        size )
  {
    stream->base   = (FT_Byte*) base;
    stream->size   = size;
    stream->pos    = 0;
    stream->cursor = NULL;
    stream->read   = NULL;
    stream->close  = NULL;
  }